

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  NamePattern *in_RDI;
  
  ~NamePattern(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}